

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

void cmd_set_arg(command_conflict *cmd,char *name,cmd_arg_type type,cmd_arg_data_conflict data)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-core.c"
                  ,600,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if (*name == '\0') {
    __assert_fail("name[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-core.c"
                  ,0x259,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  pcVar4 = cmd->arg[0].name;
  iVar3 = -1;
  lVar2 = 0;
  do {
    iVar1 = strcmp(pcVar4,name);
    if (iVar1 == 0) {
      if (((cmd_arg *)(pcVar4 + -0x10))->type == arg_STRING) {
        string_free(((cmd_arg_data_conflict *)(pcVar4 + -8))->string);
      }
      goto LAB_0012ff69;
    }
    iVar1 = (int)lVar2;
    if (iVar3 != -1) {
      iVar1 = iVar3;
    }
    if (*pcVar4 == '\0') {
      iVar3 = iVar1;
    }
    lVar2 = lVar2 + 1;
    pcVar4 = pcVar4 + 0x28;
  } while (lVar2 != 4);
  if (iVar3 == -1) {
    __assert_fail("first_empty != -1 || idx != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-core.c"
                  ,0x267,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  lVar2 = (long)iVar3;
LAB_0012ff69:
  pcVar4 = cmd->arg[lVar2].name;
  ((cmd_arg *)(pcVar4 + -0x10))->type = type;
  *(cmd_arg_data_conflict *)(pcVar4 + -8) = data;
  my_strcpy(pcVar4,name,0x14);
  return;
}

Assistant:

static void cmd_set_arg(struct command *cmd, const char *name,
						enum cmd_arg_type type, union cmd_arg_data data)
{
	size_t i;

	int first_empty = -1;
	int idx = -1;

	assert(name);
	assert(name[0]);

	/* Find an arg that either... */
	for (i = 0; i < CMD_MAX_ARGS; i++) {
		struct cmd_arg *arg = &cmd->arg[i];
		if (!arg->name[0] && first_empty == -1)
			first_empty = i;

		if (streq(arg->name, name)) {
			idx = i;
			break;
		}
	}

	assert(first_empty != -1 || idx != -1);

	if (idx == -1) {
		idx = first_empty;
	} else {
		/* Free allocated string if overwriting a string argument. */
		if (cmd->arg[idx].type == arg_STRING) {
			string_free((char*)(cmd->arg[idx].data.string));
		}
	}

	cmd->arg[idx].type = type;
	cmd->arg[idx].data = data;
	my_strcpy(cmd->arg[idx].name, name, sizeof cmd->arg[0].name);
}